

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O3

bool __thiscall LEFReader::parsePin(LEFReader *this)

{
  string *tokstr;
  bool bVar1;
  token_t tVar2;
  int iVar3;
  ostream *poVar4;
  string name;
  string endName;
  stringstream ss;
  string local_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  bVar1 = parsePinName(this,&local_218);
  if (bVar1) {
    if (this->m_curtok == TOK_EOL) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  PIN: ",7);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_218._M_dataplus._M_p,
                          local_218._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      (*this->_vptr_LEFReader[9])(this,&local_218);
      tokstr = &this->m_tokstr;
      do {
        tVar2 = tokenize(this,tokstr);
        this->m_curtok = tVar2;
        if (tVar2 == TOK_IDENT) {
          iVar3 = std::__cxx11::string::compare((char *)tokstr);
          if (iVar3 == 0) {
            parseDirection(this);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)tokstr);
            if (iVar3 == 0) {
              parseUse(this);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)tokstr);
              if (iVar3 == 0) {
                parsePort(this);
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)tokstr);
                if (iVar3 == 0) {
                  local_1d8._M_string_length = 0;
                  local_1d8.field_2._M_local_buf[0] = '\0';
                  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                  bVar1 = parsePinName(this,&local_1d8);
                  if (bVar1) {
                    if ((local_1d8._M_string_length != local_218._M_string_length) ||
                       ((local_1d8._M_string_length != 0 &&
                        (iVar3 = bcmp(local_1d8._M_dataplus._M_p,local_218._M_dataplus._M_p,
                                      local_1d8._M_string_length), iVar3 != 0)))) {
                      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)(local_1b8 + 0x10),"Expected pin name ",0x12);
                      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)(local_1b8 + 0x10),local_1d8._M_dataplus._M_p,
                                          local_1d8._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
                      std::__cxx11::stringbuf::str();
                      error(this,&local_1f8);
                      goto LAB_0012bea3;
                    }
                    bVar1 = true;
                    if (this->m_curtok != TOK_EOL) {
                      local_1b8._0_8_ = local_1b8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1b8,"Expected EOL\n","");
                      error(this,(string *)local_1b8);
                      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
                        operator_delete((void *)local_1b8._0_8_,
                                        local_1a8[0]._M_allocated_capacity + 1);
                      }
                      goto LAB_0012bedc;
                    }
                  }
                  else {
                    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_1b8 + 0x10),"Expected pin name ",0x12);
                    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)(local_1b8 + 0x10),local_1d8._M_dataplus._M_p,
                                        local_1d8._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
                    std::__cxx11::stringbuf::str();
                    error(this,&local_1f8);
LAB_0012bea3:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                      operator_delete(local_1f8._M_dataplus._M_p,
                                      local_1f8.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
                    std::ios_base::~ios_base(local_138);
LAB_0012bedc:
                    bVar1 = false;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                    operator_delete(local_1d8._M_dataplus._M_p,
                                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                                             local_1d8.field_2._M_local_buf[0]) + 1);
                  }
                  goto LAB_0012bd58;
                }
              }
            }
          }
        }
      } while (((byte)this->m_is[*(long *)(*(long *)this->m_is + -0x18) + 0x20] & 2) == 0);
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"Unexpected end of file\n","");
      error(this,(string *)local_1b8);
    }
    else {
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Expected EOL\n","");
      error(this,(string *)local_1b8);
    }
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
  }
  bVar1 = false;
LAB_0012bd58:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,
                    CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                             local_218.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool LEFReader::parsePin()
{
    std::string name;
    
    if (!parsePinName(name))
    {
        return false;
    }

    // expect EOL
    if (m_curtok != TOK_EOL)
    {
        error("Expected EOL\n");
        return false;
    }

    std::cout << "  PIN: " << name << "\n";

    onPin(name);

    while(true)
    {
        m_curtok = tokenize(m_tokstr);

        if (m_curtok == TOK_IDENT)
        {
            if (m_tokstr == "DIRECTION")
            {
                parseDirection();
            }
            else if (m_tokstr == "USE")
            {
                parseUse();
            }            
            else if (m_tokstr == "PORT")
            {
                parsePort();
            }
            else if (m_tokstr == "END")
            {
                std::string endName;
                if (!parsePinName(endName))
                {
                    std::stringstream ss;
                    ss << "Expected pin name " << endName << "\n";
                    error(ss.str());
                    return false;
                }

                if (endName != name)
                {
                    std::stringstream ss;
                    ss << "Expected pin name " << endName << "\n";
                    error(ss.str());
                    return false;
                }

                if (m_curtok != TOK_EOL)
                {
                    error("Expected EOL\n");
                    return false;
                }

                return true;
            }           
        }

        if (m_is->eof())
        {
            error("Unexpected end of file\n");
            return false;
        }
    }
}